

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O2

bool __thiscall embree::cache_regression_test::run(cache_regression_test *this)

{
  BarrierSys *this_00;
  __int_type_conflict _Var1;
  uint uVar2;
  EVP_PKEY_CTX *ctx;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> threads;
  thread_t local_50;
  _Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> local_48;
  
  uVar4 = 0;
  LOCK();
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  uVar2 = getNumberOfLogicalThreads();
  uVar3 = (ulong)uVar2;
  this_00 = &this->barrier;
  ctx = (EVP_PKEY_CTX *)(uVar3 + 1);
  BarrierSys::init(this_00,ctx);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    local_50 = createThread(thread_alloc,this,0,uVar4);
    ctx = (EVP_PKEY_CTX *)&local_50;
    std::vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>>::
    emplace_back<embree::opaque_thread_t*>
              ((vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>> *)
               &local_48,(opaque_thread_t **)&local_50);
  }
  BarrierSys::wait(this_00,ctx);
  BarrierSys::wait(this_00,ctx);
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    embree::join(local_48._M_impl.super__Vector_impl_data._M_start[uVar4]);
  }
  _Var1 = (this->numFailed).super___atomic_base<unsigned_long>._M_i;
  std::_Vector_base<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::
  ~_Vector_base(&local_48);
  return _Var1 == 0;
}

Assistant:

bool run ()
    {
      numFailed.store(0);

      size_t numThreads = getNumberOfLogicalThreads();
      barrier.init(numThreads+1);

      /* create threads */
      std::vector<thread_t> threads;
      for (size_t i=0; i<numThreads; i++)
        threads.push_back(createThread((thread_func)thread_alloc,this,0,i));

      /* run test */ 
      barrier.wait();
      barrier.wait();

      /* destroy threads */
      for (size_t i=0; i<numThreads; i++)
        join(threads[i]);

      return numFailed == 0;
    }